

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void utf8_suite::test_F8_80_80(void)

{
  char input [6];
  decoder_type decoder;
  value_type local_158 [8];
  undefined4 local_150;
  value local_14c;
  basic_decoder<char> local_148;
  
  local_148.input.tail = local_158 + 5;
  local_158[4] = '\"';
  local_158[5] = '\0';
  local_158[0] = '\"';
  local_158[1] = -8;
  local_158[2] = -0x80;
  local_158[3] = -0x80;
  local_148.input.head = local_158;
  memset(&local_148.current,0,0x120);
  local_148.current.code = uninitialized;
  local_148.current.view.head = (const_pointer)0x0;
  local_148.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_148);
  local_14c = local_148.current.code;
  local_150 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x840,"void utf8_suite::test_F8_80_80()",&local_14c,&local_150);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[5]>
            ("decoder.literal()","\"\\\"\\xF8\\x80\\x80\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x841,"void utf8_suite::test_F8_80_80()",&local_148.current.view,anon_var_dwarf_6d7f);
  return;
}

Assistant:

void api_signed()
{
    const char input[] = "42";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<int>(), 42);
}